

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CovarianceMatrix.cpp
# Opt level: O0

void __thiscall CovarianceMatrix::generateCode(CovarianceMatrix *this)

{
  bool bVar1;
  reference ppQVar2;
  reference ppAVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ostream *poVar4;
  ostream *poVar5;
  Application *in_RDI;
  ofstream ofs;
  string runFunction;
  pair<unsigned_long,_unsigned_long> *viewAggPair;
  Query *query;
  iterator __end1;
  iterator __begin1;
  vector<Query_*,_std::allocator<Query_*>_> *__range1;
  string dumpListOfQueries;
  vector<Query_*,_std::allocator<Query_*>_> *in_stack_fffffffffffff868;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff870;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff878;
  char *in_stack_fffffffffffff890;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff898;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8a0;
  string local_748 [32];
  string local_728 [32];
  string local_708 [32];
  string local_6e8 [32];
  ostream local_6c8 [512];
  string local_4c8 [32];
  string local_4a8 [32];
  string local_488 [32];
  string local_468 [32];
  string local_448 [32];
  string local_428 [32];
  string local_408 [32];
  string local_3e8 [32];
  string local_3c8 [32];
  string local_3a8 [32];
  string local_388 [32];
  string local_368 [32];
  string local_348 [32];
  string local_328 [32];
  string local_308 [32];
  string local_2e8 [32];
  string local_2c8 [32];
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  reference local_68;
  Query *local_60;
  Query **local_58;
  __normal_iterator<Query_**,_std::vector<Query_*,_std::allocator<Query_*>_>_> local_50;
  var_bitset *local_48;
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"",&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  local_48 = &in_RDI[2]._isCategoricalFeature;
  local_50._M_current =
       (Query **)std::vector<Query_*,_std::allocator<Query_*>_>::begin(in_stack_fffffffffffff868);
  local_58 = (Query **)
             std::vector<Query_*,_std::allocator<Query_*>_>::end(in_stack_fffffffffffff868);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<Query_**,_std::vector<Query_*,_std::allocator<Query_*>_>_>
                        *)in_stack_fffffffffffff870,
                       (__normal_iterator<Query_**,_std::vector<Query_*,_std::allocator<Query_*>_>_>
                        *)in_stack_fffffffffffff868);
    if (!bVar1) break;
    ppQVar2 = __gnu_cxx::
              __normal_iterator<Query_**,_std::vector<Query_*,_std::allocator<Query_*>_>_>::
              operator*(&local_50);
    local_60 = *ppQVar2;
    in_stack_fffffffffffff8a0 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    ppAVar3 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                        (&local_60->_aggregates,0);
    local_68 = std::
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ::operator[](&(*ppAVar3)->_incoming,(size_type)in_stack_fffffffffffff8a0);
    std::__cxx11::to_string((unsigned_long)in_RDI);
    std::operator+(in_stack_fffffffffffff878,(char *)in_stack_fffffffffffff870);
    std::__cxx11::to_string((unsigned_long)in_RDI);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                   in_stack_fffffffffffff8a0);
    std::operator+(in_stack_fffffffffffff878,(char *)in_stack_fffffffffffff870);
    std::__cxx11::string::operator+=(local_28,local_88);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_108);
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::string::~string(local_e8);
    __gnu_cxx::__normal_iterator<Query_**,_std::vector<Query_*,_std::allocator<Query_*>_>_>::
    operator++(&local_50);
  }
  Application::offset_abi_cxx11_(in_RDI,(size_t)in_stack_fffffffffffff8a0);
  std::operator+(in_stack_fffffffffffff878,(char *)in_stack_fffffffffffff870);
  Application::offset_abi_cxx11_(in_RDI,(size_t)in_stack_fffffffffffff8a0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                 in_stack_fffffffffffff8a0);
  std::operator+(in_stack_fffffffffffff878,(char *)in_stack_fffffffffffff870);
  Application::offset_abi_cxx11_(in_RDI,(size_t)in_stack_fffffffffffff8a0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                 in_stack_fffffffffffff8a0);
  std::operator+(in_stack_fffffffffffff878,(char *)in_stack_fffffffffffff870);
  Application::offset_abi_cxx11_(in_RDI,(size_t)in_stack_fffffffffffff8a0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                 in_stack_fffffffffffff8a0);
  std::operator+(in_stack_fffffffffffff878,(char *)in_stack_fffffffffffff870);
  Application::offset_abi_cxx11_(in_RDI,(size_t)in_stack_fffffffffffff8a0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                 in_stack_fffffffffffff8a0);
  std::operator+(in_stack_fffffffffffff878,(char *)in_stack_fffffffffffff870);
  std::operator+(in_stack_fffffffffffff878,(char *)in_stack_fffffffffffff870);
  Application::offset_abi_cxx11_(in_RDI,(size_t)in_stack_fffffffffffff8a0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                 in_stack_fffffffffffff8a0);
  std::operator+(in_stack_fffffffffffff878,(char *)in_stack_fffffffffffff870);
  Application::offset_abi_cxx11_(in_RDI,(size_t)in_stack_fffffffffffff8a0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                 in_stack_fffffffffffff8a0);
  std::operator+(in_stack_fffffffffffff878,(char *)in_stack_fffffffffffff870);
  std::operator+(in_stack_fffffffffffff878,in_stack_fffffffffffff870);
  std::operator+(in_stack_fffffffffffff878,(char *)in_stack_fffffffffffff870);
  Application::offset_abi_cxx11_(in_RDI,(size_t)in_stack_fffffffffffff8a0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                 in_stack_fffffffffffff8a0);
  std::operator+(in_stack_fffffffffffff878,(char *)in_stack_fffffffffffff870);
  std::operator+(in_stack_fffffffffffff878,(char *)in_stack_fffffffffffff870);
  Application::offset_abi_cxx11_(in_RDI,(size_t)in_stack_fffffffffffff8a0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                 in_stack_fffffffffffff8a0);
  std::operator+(in_stack_fffffffffffff878,(char *)in_stack_fffffffffffff870);
  std::__cxx11::string::~string(local_148);
  std::__cxx11::string::~string(local_4c8);
  std::__cxx11::string::~string(local_168);
  std::__cxx11::string::~string(local_188);
  std::__cxx11::string::~string(local_1a8);
  std::__cxx11::string::~string(local_4a8);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::string::~string(local_208);
  std::__cxx11::string::~string(local_228);
  std::__cxx11::string::~string(local_488);
  std::__cxx11::string::~string(local_248);
  std::__cxx11::string::~string(local_268);
  std::__cxx11::string::~string(local_468);
  std::__cxx11::string::~string(local_288);
  std::__cxx11::string::~string(local_2a8);
  std::__cxx11::string::~string(local_2c8);
  std::__cxx11::string::~string(local_448);
  std::__cxx11::string::~string(local_2e8);
  std::__cxx11::string::~string(local_308);
  std::__cxx11::string::~string(local_428);
  std::__cxx11::string::~string(local_328);
  std::__cxx11::string::~string(local_348);
  std::__cxx11::string::~string(local_408);
  std::__cxx11::string::~string(local_368);
  std::__cxx11::string::~string(local_388);
  std::__cxx11::string::~string(local_3e8);
  std::__cxx11::string::~string(local_3a8);
  std::__cxx11::string::~string(local_3c8);
  std::operator+(in_stack_fffffffffffff898,in_stack_fffffffffffff890);
  std::ofstream::ofstream(local_6c8,local_6e8,_S_out);
  std::__cxx11::string::~string(local_6e8);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::operator<<(local_6c8,"#ifndef INCLUDE_APPLICATIONHANDLER_HPP_\n");
  poVar4 = std::operator<<((ostream *)__lhs,"#define INCLUDE_APPLICATIONHANDLER_HPP_\n\n");
  poVar5 = std::operator<<(poVar4,"#include \"DataHandler.h\"\n\n");
  poVar5 = std::operator<<(poVar5,"namespace lmfao\n{\n");
  Application::offset_abi_cxx11_(in_RDI,(size_t)in_stack_fffffffffffff8a0);
  std::operator+(in_stack_fffffffffffff878,(char *)in_stack_fffffffffffff870);
  poVar5 = std::operator<<(poVar5,local_708);
  std::operator<<(poVar5,"}\n\n#endif /* INCLUDE_APPLICATIONHANDLER_HPP_*/\n");
  std::__cxx11::string::~string(local_708);
  std::__cxx11::string::~string(local_728);
  std::ofstream::close();
  std::operator+(__lhs,(char *)poVar4);
  std::ofstream::open((string *)local_6c8,(_Ios_Openmode)local_748);
  std::__cxx11::string::~string(local_748);
  poVar4 = std::operator<<(local_6c8,"#include \"ApplicationHandler.h\"\n");
  std::operator<<(poVar4,"namespace lmfao\n{\n");
  poVar4 = std::operator<<(local_6c8,local_128);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::operator<<(local_6c8,"}\n");
  std::ofstream::close();
  std::ofstream::~ofstream(local_6c8);
  std::__cxx11::string::~string(local_128);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void CovarianceMatrix::generateCode()
{
    std::string dumpListOfQueries = "";

    for (Query* query : listOfQueries)
    {
        std::pair<size_t,size_t>& viewAggPair = query->_aggregates[0]->_incoming[0];
        
        dumpListOfQueries += std::to_string(viewAggPair.first)+","+
            std::to_string(viewAggPair.second)+"\\n";
    }
    
    std::string runFunction = offset(1)+"void runApplication()\n"+offset(1)+"{\n"+
        offset(2)+"std::ofstream ofs(\"times.txt\",std::ofstream::out | std::ofstream::app);\n"+
        offset(2)+"ofs << \"\\n\";\n"+
        offset(2)+"ofs.close();\n\n"+
        "#ifdef DUMP_OUTPUT\n"+
        offset(2)+"ofs.open(\"output/covarianceMatrix.out\");\n"+
        offset(2)+"ofs << \""+dumpListOfQueries+"\";\n"+
        offset(2)+"ofs.close();\n"+
        "#endif /* DUMP_OUTPUT */ \n"+
        offset(1)+"}\n";
    
    std::ofstream ofs(multifaq::dir::OUTPUT_DIRECTORY+"ApplicationHandler.h", std::ofstream::out);
    ofs << "#ifndef INCLUDE_APPLICATIONHANDLER_HPP_\n"<<
        "#define INCLUDE_APPLICATIONHANDLER_HPP_\n\n"<<
        "#include \"DataHandler.h\"\n\n"<<
        "namespace lmfao\n{\n"<<
        offset(1)+"void runApplication();\n"<<
        "}\n\n#endif /* INCLUDE_APPLICATIONHANDLER_HPP_*/\n";    
    ofs.close();

    ofs.open(multifaq::dir::OUTPUT_DIRECTORY+"ApplicationHandler.cpp", std::ofstream::out);
    ofs << "#include \"ApplicationHandler.h\"\n"
        << "namespace lmfao\n{\n";
    ofs << runFunction << std::endl;
    ofs << "}\n";
    ofs.close();
}